

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O2

int __thiscall PInt::GetStoreOp(PInt *this)

{
  int iVar1;
  
  iVar1 = *(int *)&this->field_0x24;
  if (iVar1 == 4) {
    iVar1 = 0x22;
  }
  else if (iVar1 == 2) {
    iVar1 = 0x20;
  }
  else {
    if (iVar1 != 1) {
      __assert_fail("0 && \"Unhandled integer size\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/dobjtype.cpp"
                    ,0x430,"virtual int PInt::GetStoreOp() const");
    }
    iVar1 = 0x1e;
  }
  return iVar1;
}

Assistant:

int PInt::GetStoreOp() const
{
	if (Size == 4)
	{
		return OP_SW;
	}
	else if (Size == 1)
	{
		return OP_SB;
	}
	else if (Size == 2)
	{
		return OP_SH;
	}
	else
	{
		assert(0 && "Unhandled integer size");
		return OP_NOP;
	}
}